

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int imcomp_scalevaluesi2(short *idata,long tilelen,double scale,double zero,int *status)

{
  long lVar1;
  short sVar2;
  double dVar3;
  
  lVar1 = 0;
  if (tilelen < 1) {
    tilelen = lVar1;
  }
  for (; tilelen != lVar1; lVar1 = lVar1 + 1) {
    dVar3 = ((double)(int)idata[lVar1] - zero) / scale;
    if (-32768.49 <= dVar3) {
      if (dVar3 <= 32767.49) {
        if (0.0 <= dVar3) {
          dVar3 = dVar3 + 0.5;
        }
        else {
          dVar3 = dVar3 + -0.5;
        }
        sVar2 = (short)(int)dVar3;
      }
      else {
        *status = -0xb;
        sVar2 = 0x7fff;
      }
    }
    else {
      *status = -0xb;
      sVar2 = -0x8000;
    }
    idata[lVar1] = sVar2;
  }
  return *status;
}

Assistant:

int imcomp_scalevaluesi2(
     short *idata, 
     long tilelen,
     double scale,
     double zero,
     int *status)
/*
   do inverse scaling the integer values.
*/
{
    long ii;
    double dvalue;
    
    for (ii=0; ii < tilelen; ii++)
    {
            dvalue = (idata[ii] - zero) / scale;

            if (dvalue < DSHRT_MIN)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = SHRT_MIN;
            }
            else if (dvalue > DSHRT_MAX)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = SHRT_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    idata[ii] = (int) (dvalue + .5);
                else
                    idata[ii] = (int) (dvalue - .5);
            }
    }
    return(*status);
}